

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adam_benchmark.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  iterator iVar1;
  unsigned_long uVar2;
  rep rVar3;
  ostream *poVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>
  __l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  pointer local_1a8;
  pointer local_1a0;
  vector<char,_std::allocator<char>_> inBuffer;
  FuncMap funcMap;
  function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> dest;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>
  local_70;
  
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,argv,
             argv + argc,(allocator_type *)&dest);
  if ((long)args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x80) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>
    ::
    pair<const_char_(&)[2],_void_(&)(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&),_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>
                *)&dest,(char (*) [2])"c",testCFileIO);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>
    ::
    pair<const_char_(&)[6],_void_(&)(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&),_true>
              (&local_f0,(char (*) [6])"posix",testPosixIO);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>
    ::
    pair<const_char_(&)[4],_void_(&)(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&),_true>
              (&local_b0,(char (*) [4])"c++",testCppIO);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>
    ::
    pair<const_char_(&)[7],_void_(&)(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&),_true>
              (&local_70,(char (*) [7])"modern",testModernIO);
    __l._M_len = 4;
    __l._M_array = (iterator)&dest;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>_>
    ::map(&funcMap,__l,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          &inBuffer,(allocator_type *)&local_1a8);
    lVar6 = 0xc0;
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>
               *)((long)&dest._M_dataplus._M_p + lVar6));
      lVar6 = lVar6 + -0x40;
    } while (lVar6 != -0x40);
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>_>
            ::find(&funcMap._M_t,
                   args.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1);
    if ((_Rb_tree_header *)iVar1._M_node == &funcMap._M_t._M_impl.super__Rb_tree_header) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Not supported copy method: ");
      poVar4 = std::operator<<(poVar4,(string *)
                                      (args.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1));
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      std::vector<char,_std::allocator<char>_>::vector(&inBuffer,0x100000,(allocator_type *)&dest);
      std::operator+(&dest,args.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 2,".copy");
      uVar2 = std::__cxx11::stoul(args.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 3,(size_t *)0x0,10);
      lVar6 = 0;
      for (uVar7 = 0; uVar7 < uVar2; uVar7 = (ulong)((int)uVar7 + 1)) {
        std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>
        ::function(&local_150,
                   (function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>
                    *)(iVar1._M_node + 2));
        local_1a8 = args.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
        local_1a0 = dest._M_dataplus._M_p;
        rVar3 = measure::
                ms<std::function<void(char_const*,char_const*,std::vector<char,std::allocator<char>>&)>,char_const*,char_const*,std::vector<char,std::allocator<char>>&>
                          (&local_150,&local_1a8,&local_1a0,&inBuffer);
        lVar6 = lVar6 + rVar3;
        std::_Function_base::~_Function_base(&local_150.super__Function_base);
        unlink(dest._M_dataplus._M_p);
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"Average ");
      poVar4 = std::operator<<(poVar4,(string *)
                                      (args.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1));
      std::operator<<(poVar4," I/O took: ");
      poVar4 = std::ostream::_M_insert<double>((double)lVar6 / (double)(long)uVar2);
      poVar4 = std::operator<<(poVar4,"ms");
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)&dest);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&inBuffer.super__Vector_base<char,_std::allocator<char>_>);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>_>
    ::~_Rb_tree(&funcMap._M_t);
    iVar5 = 0;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar4 = std::operator<<(poVar4,(string *)
                                    args.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
    poVar4 = std::operator<<(poVar4," copy_method (c, posix, c++) in_file number_of_times");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar5 = 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  return iVar5;
}

Assistant:

int main(int argc, char* argv[])
{
    std::vector<std::string> args(argv, argv + argc);
    if (args.size() != 4)
    {
        std::cout << "Usage: " << args[0] << " copy_method (c, posix, c++) in_file number_of_times" << std::endl;
        return 1;
    }

    typedef std::map<std::string, std::function<void (const char*, const char*, std::vector<char>&)>> FuncMap;
    FuncMap funcMap { {"c", testCFileIO}, {"posix", testPosixIO}, {"c++", testCppIO}, {"modern", testModernIO}};

    auto it = funcMap.find(args[1]);
    if (it != funcMap.end())
    {
        std::vector<char> inBuffer(1024 * 1024);

        auto dest = args[2] + ".copy";
        const auto times = std::stoul(args[3]);

        milliseconds::rep total = 0;
        for (unsigned int i = 0; i < times; ++i)
        {
            total += measure::ms(it->second, args[2].c_str(), dest.c_str(), inBuffer);
            ::unlink(dest.c_str());
        }
        std::cout << "Average " << args[1] << " I/O took: " << total / double(times) << "ms" << std::endl;
    }
    else
    {
        std::cout << "Not supported copy method: " << args[1] << std::endl;
    }
}